

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Line.cpp
# Opt level: O3

void __thiscall Line::generate_options(Line *this,Known *known)

{
  _Vector_impl_data *p_Var1;
  int iVar2;
  ulong *puVar3;
  pointer piVar4;
  void *pvVar5;
  bool bVar6;
  int *piVar7;
  int *single_required;
  int *piVar8;
  pointer piVar9;
  ulong uVar10;
  ulong *puVar11;
  ulong *puVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  pointer *ppiVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  int *piVar23;
  vector<int,_std::allocator<int>_> required;
  vector<int,_std::allocator<int>_> iterators;
  pair<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  generated_possibilities;
  allocator_type local_b9;
  int *local_b8;
  iterator iStack_b0;
  int *local_a8;
  vector<int,_std::allocator<int>_> local_a0;
  vector<bool,_std::allocator<bool>_> local_88;
  pair<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  local_60;
  
  puVar11 = (known->first).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  puVar3 = (known->first).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  uVar22 = (known->first).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  uVar16 = (ulong)uVar22;
  lVar20 = (long)puVar3 - (long)puVar11;
  lVar15 = (long)(uVar16 + lVar20 * 8) >> 2;
  if (lVar15 < 1) {
    uVar21 = 0;
  }
  else {
    lVar15 = lVar15 + 1;
    uVar21 = 0;
    do {
      uVar14 = (uint)uVar21;
      puVar12 = puVar11;
      uVar19 = uVar14;
      if ((*puVar11 >> (uVar21 & 0x3f) & 1) == 0) goto LAB_00105cbe;
      if (uVar14 == 0x3f) {
        uVar10 = puVar11[1];
        puVar12 = puVar11 + 1;
        if ((uVar10 & 1) == 0) goto LAB_00105c84;
        uVar21 = 2;
        uVar14 = 1;
        uVar19 = uVar14;
        if ((uVar10 & 2) == 0) goto LAB_00105cbe;
LAB_00105bef:
        uVar19 = (uint)uVar21;
        if ((uVar10 >> (uVar21 & 0x3f) & 1) == 0) goto LAB_00105cbe;
        puVar11 = puVar12 + (uVar19 == 0x3f);
        uVar21 = (ulong)(uVar14 + 2);
        if (uVar19 == 0x3f) {
          uVar21 = 0;
        }
      }
      else {
        uVar19 = uVar14 + 1;
        if ((*puVar11 >> ((ulong)uVar19 & 0x3f) & 1) == 0) goto LAB_00105cbe;
        puVar12 = puVar11 + (uVar19 == 0x3f);
        uVar21 = (ulong)(uVar14 + 2);
        if (uVar19 == 0x3f) {
          uVar21 = 0;
        }
        uVar14 = (uint)uVar21;
        uVar10 = *puVar12;
        uVar19 = uVar14;
        if ((uVar10 >> (uVar21 & 0x3f) & 1) == 0) goto LAB_00105cbe;
        if (uVar14 != 0x3f) {
          uVar21 = (ulong)(uVar14 + 1);
          goto LAB_00105bef;
        }
        puVar11 = puVar12 + 1;
        uVar21 = 1;
        if ((puVar12[1] & 1) == 0) {
          puVar12 = puVar11;
          uVar19 = 0;
          goto LAB_00105cbe;
        }
      }
      lVar15 = lVar15 + -1;
    } while (1 < lVar15);
    lVar20 = (long)puVar3 - (long)puVar11;
    uVar16 = uVar16 - uVar21;
  }
  uVar14 = (uint)uVar21;
  lVar15 = uVar16 + lVar20 * 8;
  puVar12 = puVar11;
  if (lVar15 != 1) {
    if (lVar15 == 3) {
      uVar16 = *puVar11;
      uVar19 = uVar14;
      if ((uVar16 >> (uVar21 & 0x3f) & 1) == 0) goto LAB_00105cbe;
      if (uVar14 == 0x3f) {
        puVar12 = puVar11 + 1;
        uVar21 = 1;
        if ((puVar11[1] & 1) == 0) {
LAB_00105c84:
          uVar19 = 0;
          goto LAB_00105cbe;
        }
        goto LAB_00105cab;
      }
      uVar14 = uVar14 + 1;
      uVar21 = (ulong)uVar14;
    }
    else {
      puVar12 = puVar3;
      uVar19 = uVar22;
      if (lVar15 != 2) goto LAB_00105cbe;
      uVar16 = *puVar11;
    }
    puVar12 = puVar11;
    uVar19 = uVar14;
    if ((uVar16 >> (uVar21 & 0x3f) & 1) == 0) goto LAB_00105cbe;
    puVar12 = puVar11 + (uVar14 == 0x3f);
    uVar19 = 0;
    if (uVar14 != 0x3f) {
      uVar19 = uVar14 + 1;
    }
    uVar21 = (ulong)uVar19;
  }
LAB_00105cab:
  uVar19 = (uint)uVar21;
  if ((*puVar12 >> (uVar21 & 0x3f) & 1) != 0) {
    puVar12 = puVar3;
    uVar19 = uVar22;
  }
LAB_00105cbe:
  if ((puVar12 == puVar3) && (uVar19 == uVar22)) {
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&local_60,&known->second);
    std::
    vector<std::vector<bool,std::allocator<bool>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
    ::_M_assign_aux<std::vector<bool,std::allocator<bool>>const*>
              ((vector<std::vector<bool,std::allocator<bool>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
                *)this,&local_60,
               &local_60.second.
                super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
              ((_Bvector_base<std::allocator<bool>_> *)&local_60);
    return;
  }
  generate_possible_per_number(&local_60,this,known);
  local_b8 = (int *)0x0;
  iStack_b0._M_current = (int *)0x0;
  local_a8 = (int *)0x0;
  local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p._0_4_ = 0;
  if (this->m_size != 0) {
    do {
      uVar22 = (uint)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 0x3f;
      if (-1 < (int)(uint)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) {
        uVar22 = (uint)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      }
      uVar16 = (ulong)(((long)(int)(uint)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl
                                         .super__Bvector_impl_data._M_start.super__Bit_iterator_base
                                         ._M_p & 0x800000000000003fU) < 0x8000000000000001);
      if (((*(ulong *)((long)(known->first).super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                       (long)((int)uVar22 >> 6) * 8 + -8 + uVar16 * 8) >>
            ((long)(int)(uint)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p &
            0x3fU) & 1) != 0) &&
         (((known->second).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
           [(long)((int)uVar22 >> 6) + uVar16 + 0xffffffffffffffff] &
          1L << ((byte)(uint)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 0x3f)
          ) != 0)) {
        if (iStack_b0._M_current == local_a8) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_b8,iStack_b0,(int *)&local_88);
        }
        else {
          *iStack_b0._M_current =
               (uint)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          iStack_b0._M_current = iStack_b0._M_current + 1;
        }
      }
      local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p._0_4_ =
           (uint)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 1;
    } while ((uint)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p < this->m_size);
  }
  local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_a0,
             (long)(this->m_numbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_numbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,(value_type_conflict2 *)&local_88,&local_b9
            );
LAB_00105dff:
  generate_option(&local_88,this,&local_a0,&local_60.first);
  if (local_b8 != iStack_b0._M_current) {
    piVar8 = local_b8;
    do {
      iVar2 = *piVar8;
      uVar16 = (ulong)iVar2;
      iVar13 = iVar2 + 0x3f;
      if (-1 < (long)uVar16) {
        iVar13 = iVar2;
      }
      if ((*(ulong *)(CONCAT44(local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_
                               ,(uint)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                      _M_p) + (long)(iVar13 >> 6) * 8 + -8 +
                     (ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
           (uVar16 & 0x3f) & 1) == 0) {
        if (iVar2 != -1) {
          piVar9 = (this->m_numbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar10 = (long)(this->m_numbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar9;
          uVar21 = uVar10 >> 2 & 0xffffffff;
          uVar16 = uVar21 + 1;
          goto LAB_00105e91;
        }
        break;
      }
      piVar8 = piVar8 + 1;
    } while (piVar8 != iStack_b0._M_current);
  }
  std::
  vector<std::vector<bool,std::allocator<bool>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
  ::emplace_back<std::vector<bool,std::allocator<bool>>>
            ((vector<std::vector<bool,std::allocator<bool>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
              *)this,&local_88);
  piVar9 = (this->m_numbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = (long)(this->m_numbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)piVar9;
  uVar21 = uVar10 >> 2 & 0xffffffff;
  goto LAB_00105f08;
  while( true ) {
    uVar22 = uVar22 & 0x7fffffff;
    iVar13 = local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar22];
    piVar4 = local_60.first.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar22].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    uVar16 = uVar16 - 1;
    if (piVar4[iVar13] <= iVar2) break;
LAB_00105e91:
    uVar22 = (int)uVar16 - 2;
    if ((int)uVar22 < 0) {
      bVar6 = false;
      goto LAB_00105feb;
    }
  }
  if (((long)local_60.first.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar22].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       - (long)piVar4 >> 2) + -1 == (long)iVar13) {
LAB_00105f08:
    ppiVar17 = &local_60.first.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar21 - 1].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish;
    do {
      uVar16 = uVar21;
      if ((int)uVar16 < 1) {
        bVar6 = false;
        goto LAB_00105feb;
      }
      piVar4 = *ppiVar17;
      p_Var1 = (_Vector_impl_data *)(ppiVar17 + -1);
      ppiVar17 = ppiVar17 + -3;
      uVar21 = uVar16 - 1;
    } while (((long)piVar4 - (long)p_Var1->_M_start >> 2) + -1 ==
             (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar16 - 1]);
    piVar8 = local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start + (uVar16 - 1 & 0xffffffff);
    iVar13 = *piVar8;
  }
  else {
    piVar8 = local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start + uVar22;
  }
  *piVar8 = iVar13 + 1;
  for (uVar16 = (ulong)(int)uVar16; bVar6 = true, uVar16 < (ulong)((long)uVar10 >> 2);
      uVar16 = uVar16 + 1) {
    piVar8 = local_60.first.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar16].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    uVar21 = (long)local_60.first.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar16].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish - (long)piVar8 >> 2;
    piVar23 = piVar8;
    if (0 < (long)uVar21) {
      do {
        uVar18 = uVar21 >> 1;
        uVar21 = ~uVar18 + uVar21;
        piVar7 = piVar23 + uVar18 + 1;
        if (piVar9[uVar16 - 1] +
            local_60.first.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar16 - 1].
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar16 - 1]] < piVar23[uVar18]) {
          uVar21 = uVar18;
          piVar7 = piVar23;
        }
        piVar23 = piVar7;
      } while (0 < (long)uVar21);
    }
    local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [uVar16] = (int)((ulong)((long)piVar23 - (long)piVar8) >> 2);
  }
LAB_00105feb:
  pvVar5 = (void *)CONCAT44(local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,
                            (uint)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,(long)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_end_of_storage - (long)pvVar5);
  }
  if (!bVar6) {
    if (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_b8 != (int *)0x0) {
      operator_delete(local_b8,(long)local_a8 - (long)local_b8);
    }
    std::
    vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::~vector(&local_60.second);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_60.first);
    return;
  }
  goto LAB_00105dff;
}

Assistant:

void Line::generate_options(const Known &known) {
#if DEBUG_LOGS
    Logger(DEBUG).get() << "Originally possible " << get_combinations_number() << " options" << endl;
#endif // DEBUG_LOGS

    if (all_of(known.first.begin(), known.first.end(), [](bool v) { return v; })) {
        m_options = {known.second};

#if DEBUG_LOGS
        Logger(DEBUG).get() << "All known" << endl;
#endif // DEBUG_LOGS

        return;
    }

    auto generated_possibilities = generate_possible_per_number(known);
    vector<vector<int>> &possible_per_number = generated_possibilities.first;
    vector<set<int>> &extended_possible_per_place = generated_possibilities.second;

    // Get known black.
    vector<int> required;
    for (int i = 0; i < m_size; i++) {
        if (known.first[i] && known.second[i]) {
            required.push_back(i);
        }
    }

    vector<int> iterators(m_numbers.size(), 0);
    int index;
    int required_filler;
    int generated = 0;

    // Generate all options for the line.
    while (true) {
        bool advanced = false;
        auto option = generate_option(iterators, possible_per_number);
        generated++;

        int failed_required = check_option_by_required(required, option);
        if (failed_required == -1) {
            m_options.push_back(move(option));
        } else {
            for (required_filler = m_numbers.size() - 1;
                 (required_filler >= 0) && (possible_per_number[required_filler][iterators[required_filler]] >
                                            failed_required); required_filler--);
            if (required_filler < 0) break;
            if (iterators[required_filler] != possible_per_number[required_filler].size() - 1) {
                iterators[required_filler]++;
                advanced = true;
                index = required_filler + 1;
            }
        }

        if (!advanced) {
            for (index = (int) m_numbers.size() - 1;
                 (index >= 0) && (iterators[index] == possible_per_number[index].size() - 1); index--);
            if (index < 0) break;

            iterators[index]++;
            index++;
        }

        for (; index < m_numbers.size(); index++) {
            int lower_limit = possible_per_number[index - 1][iterators[index - 1]] + m_numbers[index - 1] + 1;
            auto t = lower_bound(possible_per_number[index].begin(), possible_per_number[index].end(), lower_limit);
            iterators[index] = t - possible_per_number[index].begin();
        }
    }

#if DEBUG_LOGS
    Logger(DEBUG).get() << "Generated " << m_options.size() << " options (saved "
                        << get_combinations_number() - generated << " by optimization and "
                        << generated - m_options.size() << " by filtering)" << endl;
#endif // DEBUG_LOGS
}